

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-precede.cpp
# Opt level: O2

Clause * __thiscall seq_precede_inc::explain(seq_precede_inc *this,Lit param_1,int inf_id)

{
  IntVar *pIVar1;
  bool bVar2;
  Clause *pCVar3;
  tag_t t;
  uint uVar4;
  uint xi;
  ulong uVar5;
  ulong uVar6;
  long v;
  Lit LStack_50;
  uint uStack_4c;
  vec<Lit> vStack_48;
  
  xi = (uint)inf_id >> 1 & 0x7fff;
  uVar4 = (uint)inf_id >> 0x10;
  if ((inf_id & 1U) != 0) {
    pCVar3 = ex_ub(this,xi,uVar4);
    return pCVar3;
  }
  vStack_48.sz = 0;
  vStack_48.cap = 0;
  vStack_48.data = (Lit *)0x0;
  vec<Lit>::push(&vStack_48);
  uVar5 = 0;
  uVar6 = 0;
  if (xi != 0) {
    uVar6 = (ulong)xi;
  }
  uStack_4c = uVar4;
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    pIVar1 = (this->xs).data[uVar5];
    LStack_50.x = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])
                            (pIVar1,(long)(int)uVar4,2);
    vec<Lit>::push(&vStack_48,&LStack_50);
  }
  uVar4 = uStack_4c;
  do {
    v = (long)(int)uVar4;
    while( true ) {
      xi = xi + 1;
      pIVar1 = (this->xs).data[xi];
      if ((int)uVar4 < (pIVar1->min).v) {
        LStack_50.x = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,v,3);
        vec<Lit>::push(&vStack_48,&LStack_50);
        pCVar3 = Reason_new<vec<Lit>>(&vStack_48);
        free(vStack_48.data);
        return pCVar3;
      }
      bVar2 = IntVar::indomain(pIVar1,v);
      if (bVar2) break;
      pIVar1 = (this->xs).data[xi];
      LStack_50.x = (*(pIVar1->super_Var).super_Branching._vptr_Branching[0xd])(pIVar1,v,1);
      vec<Lit>::push(&vStack_48,&LStack_50);
    }
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

Clause* explain(Lit /*p*/, int inf_id) override {
		const tag_t t(conv<tag_t, int>(inf_id));
		if (t.flag) {
			// Upper bound
			return ex_ub(t.x, t.k);
		}  // Lower bound
		return ex_lb(t.x, t.k);
	}